

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfTimeCodeAttribute.cpp
# Opt level: O0

void __thiscall
Imf_3_4::TypedAttribute<Imf_3_4::TimeCode>::readValueFrom
          (TypedAttribute<Imf_3_4::TimeCode> *this,IStream *is,int size,int version)

{
  uint *in_RDI;
  uint tmp;
  undefined4 in_stack_ffffffffffffffe0;
  uint in_stack_ffffffffffffffe4;
  
  Xdr::read<Imf_3_4::StreamIO,Imf_3_4::IStream>
            ((IStream *)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0),in_RDI);
  TimeCode::setTimeAndFlags
            ((TimeCode *)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0),
             (uint)((ulong)in_RDI >> 0x20),(Packing)in_RDI);
  Xdr::read<Imf_3_4::StreamIO,Imf_3_4::IStream>
            ((IStream *)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0),in_RDI);
  TimeCode::setUserData((TimeCode *)(in_RDI + 2),in_stack_ffffffffffffffe4);
  return;
}

Assistant:

IMF_EXPORT void
TimeCodeAttribute::readValueFrom (
    OPENEXR_IMF_INTERNAL_NAMESPACE::IStream& is, int size, int version)
{
    unsigned int tmp;

    Xdr::read<StreamIO> (is, tmp);
    _value.setTimeAndFlags (tmp);

    Xdr::read<StreamIO> (is, tmp);
    _value.setUserData (tmp);
}